

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

int Dtc_ManCompare(int *pCut0,int *pCut1)

{
  int iVar1;
  int iVar2;
  
  iVar1 = -1;
  if (*pCut0 < *pCut1) {
    return iVar1;
  }
  iVar2 = 1;
  if (*pCut0 <= *pCut1) {
    if (pCut0[1] < pCut1[1]) {
      return iVar1;
    }
    if (pCut0[1] <= pCut1[1]) {
      iVar2 = iVar1;
      if (pCut1[2] <= pCut0[2]) {
        return (int)(pCut1[2] < pCut0[2]);
      }
    }
  }
  return iVar2;
}

Assistant:

int Dtc_ManCompare( int * pCut0, int * pCut1 )
{
    if ( pCut0[0] < pCut1[0] ) return -1;
    if ( pCut0[0] > pCut1[0] ) return  1;
    if ( pCut0[1] < pCut1[1] ) return -1;
    if ( pCut0[1] > pCut1[1] ) return  1;
    if ( pCut0[2] < pCut1[2] ) return -1;
    if ( pCut0[2] > pCut1[2] ) return  1;
    return 0;
}